

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

void __thiscall CaDiCaL::Solver::add(Solver *this,int lit)

{
  State SVar1;
  char *__ptr;
  size_t sStack_20;
  
  if ((this->internal != (Internal *)0x0) && (this->trace_api_file != (FILE *)0x0)) {
    trace_api_call(this,"add",lit);
  }
  require_solver_pointer_to_be_non_zero
            (this,"void CaDiCaL::Solver::add(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
            );
  if (this->external == (External *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ","void CaDiCaL::Solver::add(int)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    __ptr = "external solver not initialized";
  }
  else {
    if (this->internal != (Internal *)0x0) {
      if ((this->_state & VALID) != 0) {
        transition_to_steady_state(this);
        External::add(this->external,lit);
        this->adding_clause = lit != 0;
        if (lit == 0) {
          if (this->adding_constraint != false) {
            return;
          }
          if (this->_state == STEADY) {
            return;
          }
          SVar1 = STEADY;
        }
        else {
          if (this->_state == ADDING) {
            return;
          }
          SVar1 = ADDING;
        }
        this->_state = SVar1;
        return;
      }
      fatal_message_start();
      fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ","void CaDiCaL::Solver::add(int)",
              "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             );
      __ptr = "solver in invalid state";
      sStack_20 = 0x17;
      goto LAB_00684bf5;
    }
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ","void CaDiCaL::Solver::add(int)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    __ptr = "internal solver not initialized";
  }
  sStack_20 = 0x1f;
LAB_00684bf5:
  fwrite(__ptr,sStack_20,1,_stderr);
  fputc(10,_stderr);
  fflush(_stderr);
  abort();
}

Assistant:

void Solver::add (int lit) {
  TRACE ("add", lit);
  REQUIRE_VALID_STATE ();
  if (lit)
    REQUIRE_VALID_LIT (lit);
  transition_to_steady_state ();
  external->add (lit);
  adding_clause = lit;
  if (adding_clause)
    STATE (ADDING);
  else if (!adding_constraint)
    STATE (STEADY);
  LOG_API_CALL_END ("add", lit);
}